

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Chapters::Atom::ExpandDisplaysArray(Atom *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  int iVar9;
  ulong uVar10;
  Display *pDVar11;
  long lVar12;
  
  iVar3 = this->m_displays_size;
  if (this->m_displays_count < iVar3) {
    return true;
  }
  iVar9 = 1;
  if (iVar3 != 0) {
    iVar9 = iVar3 * 2;
  }
  uVar10 = (ulong)iVar9;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  uVar6 = SUB168(auVar4 * ZEXT816(0x18),0);
  uVar7 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
    uVar6 = uVar7;
  }
  puVar8 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
  if (puVar8 == (ulong *)0x0) {
    return false;
  }
  *puVar8 = uVar10;
  lVar12 = 0;
  pDVar11 = (Display *)(puVar8 + 1);
  do {
    Display::Display(pDVar11);
    lVar12 = lVar12 + -0x18;
    pDVar11 = pDVar11 + 1;
  } while (-lVar12 != uVar10 * 0x18);
  iVar3 = this->m_displays_count;
  pDVar11 = this->m_displays;
  if ((long)iVar3 < 1) {
    if (pDVar11 == (Display *)0x0) goto LAB_0082d27a;
  }
  else {
    lVar12 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pDVar11->m_string + lVar12);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar8 + lVar12 + 8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      *(undefined8 *)((long)puVar8 + lVar12 + 0x18) =
           *(undefined8 *)((long)&pDVar11->m_country + lVar12);
      lVar12 = lVar12 + 0x18;
    } while ((long)iVar3 * 0x18 != lVar12);
  }
  if (pDVar11[-1].m_country != (char *)0x0) {
    lVar12 = (long)pDVar11[-1].m_country * 0x18;
    do {
      Display::~Display((Display *)((long)&pDVar11[-1].m_string + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != 0);
  }
  operator_delete__(&pDVar11[-1].m_country);
LAB_0082d27a:
  this->m_displays = (Display *)(puVar8 + 1);
  this->m_displays_size = iVar9;
  return true;
}

Assistant:

bool Chapters::Atom::ExpandDisplaysArray() {
  if (m_displays_size > m_displays_count)
    return true;  // nothing else to do

  const int size = (m_displays_size == 0) ? 1 : 2 * m_displays_size;

  Display* const displays = new (std::nothrow) Display[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_displays_count; ++idx) {
    m_displays[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_displays;
  m_displays = displays;

  m_displays_size = size;
  return true;
}